

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_set_status(nng_http *conn,nng_http_status status,char *reason)

{
  int iVar1;
  char *__s2;
  char *local_28;
  char *dup;
  char *reason_local;
  nng_http_status status_local;
  nng_http *conn_local;
  
  conn->code = status;
  local_28 = (char *)0x0;
  if (reason != (char *)0x0) {
    __s2 = nni_http_reason(conn->code);
    iVar1 = strcmp(reason,__s2);
    if (iVar1 == 0) {
      local_28 = (char *)0x0;
    }
    else {
      local_28 = nni_strdup(reason);
    }
  }
  nni_strfree(conn->rsn);
  conn->rsn = local_28;
  return;
}

Assistant:

void
nni_http_set_status(nng_http *conn, nng_http_status status, const char *reason)
{
	conn->code = status;
	char *dup  = NULL;
	if (reason != NULL) {
		if (strcmp(reason, nni_http_reason(conn->code)) == 0) {
			dup = NULL;
		} else {
			// This might fail, but if it does, we will just
			// use the built in reason, which should not
			// fundamentally affect semantics.  This allows us to
			// make this function void, and avoid some error
			// handling.
			dup = nni_strdup(reason);
		}
	}
	nni_strfree(conn->rsn);
	conn->rsn = dup;
}